

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O0

target_ulong_conflict cpu_ppc_load_hdecr_ppc64(CPUPPCState_conflict2 *env)

{
  int64_t iVar1;
  uint64_t hdecr;
  ppc_tb_t *tb_env;
  PowerPCCPUClass_conflict1 *pcc;
  PowerPCCPU_conflict3 *cpu;
  CPUPPCState_conflict2 *env_local;
  
  env_archcpu(env);
  iVar1 = _cpu_ppc_load_decr(env,env->tb_env->hdecr_next);
  env_local._0_4_ = (target_ulong_conflict)iVar1;
  return (target_ulong_conflict)env_local;
}

Assistant:

target_ulong cpu_ppc_load_hdecr(CPUPPCState *env)
{
    PowerPCCPU *cpu = env_archcpu(env);
    PowerPCCPUClass *pcc = POWERPC_CPU_GET_CLASS(cpu);
    ppc_tb_t *tb_env = env->tb_env;
    uint64_t hdecr;

    hdecr =  _cpu_ppc_load_decr(env, tb_env->hdecr_next);

    /*
     * If we have a large decrementer (POWER9 or later) then hdecr is sign
     * extended to 64 bits, otherwise it is 32 bits.
     */
    if (pcc->lrg_decr_bits > 32) {
        return hdecr;
    }
    return (uint32_t) hdecr;
}